

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::EnsureDebugManager(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *alloc;
  DebugManager *this_00;
  undefined4 *puVar3;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->debugManager == (DebugManager *)0x0) {
    local_48 = (undefined1  [8])&Js::DebugManager::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_314c66c;
    data.filename._0_4_ = 0x8e1;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (DebugManager *)new<Memory::HeapAllocator>(0x218,alloc,0x2ff150);
    Js::DebugManager::DebugManager(this_00,this,this->allocationPolicyManager);
    this->debugManager = this_00;
  }
  LOCK();
  this->crefSContextForDiag = this->crefSContextForDiag + 1;
  UNLOCK();
  if (this->debugManager == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8e4,"(this->debugManager != nullptr)","this->debugManager != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ThreadContext::EnsureDebugManager()
{
    if (this->debugManager == nullptr)
    {
        this->debugManager = HeapNew(Js::DebugManager, this, this->GetAllocationPolicyManager());
    }
    InterlockedIncrement(&crefSContextForDiag);
    Assert(this->debugManager != nullptr);
}